

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_fp_compare(DisasContext_conflict1 *s,uint32_t insn)

{
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t rm_00;
  uint32_t uVar4;
  uint32_t rn_00;
  uint32_t uVar5;
  uint32_t uVar6;
  int local_34;
  int size;
  uint op2r;
  uint opc;
  uint rn;
  uint op;
  uint rm;
  uint type;
  uint mos;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  uVar2 = extract32(insn,0x1d,3);
  uVar3 = extract32(insn,0x16,2);
  rm_00 = extract32(insn,0x10,5);
  uVar4 = extract32(insn,0xe,2);
  rn_00 = extract32(insn,5,5);
  uVar5 = extract32(insn,3,2);
  uVar6 = extract32(insn,0,3);
  if (((uVar2 != 0) || (uVar4 != 0)) || (uVar6 != 0)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (uVar3 == 0) {
    local_34 = 2;
  }
  else {
    if (uVar3 != 1) {
      if (uVar3 == 3) {
        local_34 = 1;
        _Var1 = isar_feature_aa64_fp16(s->isar);
        if (_Var1) goto LAB_0082a747;
      }
      unallocated_encoding_aarch64(s);
      return;
    }
    local_34 = 3;
  }
LAB_0082a747:
  _Var1 = fp_access_check(s);
  if (_Var1) {
    handle_fp_compare(s,local_34,rn_00,rm_00,(uVar5 & 1) != 0,(uVar5 & 2) != 0);
  }
  return;
}

Assistant:

static void disas_fp_compare(DisasContext *s, uint32_t insn)
{
    unsigned int mos, type, rm, op, rn, opc, op2r;
    int size;

    mos = extract32(insn, 29, 3);
    type = extract32(insn, 22, 2);
    rm = extract32(insn, 16, 5);
    op = extract32(insn, 14, 2);
    rn = extract32(insn, 5, 5);
    opc = extract32(insn, 3, 2);
    op2r = extract32(insn, 0, 3);

    if (mos || op || op2r) {
        unallocated_encoding(s);
        return;
    }

    switch (type) {
    case 0:
        size = MO_32;
        break;
    case 1:
        size = MO_64;
        break;
    case 3:
        size = MO_16;
        if (dc_isar_feature(aa64_fp16, s)) {
            break;
        }
        /* fallthru */
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    handle_fp_compare(s, size, rn, rm, opc & 1, opc & 2);
}